

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::Arg(Arg *this,Arg *param_1)

{
  Arg *param_1_local;
  Arg *this_local;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (&this->boundField,&param_1->boundField);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->shortNames,&param_1->shortNames);
  std::__cxx11::string::string((string *)&this->longName,(string *)&param_1->longName);
  std::__cxx11::string::string((string *)&this->description,(string *)&param_1->description);
  std::__cxx11::string::string((string *)&this->hint,(string *)&param_1->hint);
  this->position = param_1->position;
  return;
}

Assistant:

bool hasShortName( std::string const& shortName ) const {
                for(    std::vector<std::string>::const_iterator
                            it = shortNames.begin(), itEnd = shortNames.end();
                        it != itEnd;
                        ++it )
                    if( *it == shortName )
                        return true;
                return false;
            }